

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O3

int __thiscall
sqvector<long_long>::copy(sqvector<long_long> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  long lVar1;
  longlong *in_RAX;
  longlong *extraout_RAX;
  ulong uVar2;
  ulong uVar3;
  longlong local_20;
  
  if (this->_size != 0) {
    local_20 = 0;
    resize(this,0,&local_20);
    in_RAX = extraout_RAX;
  }
  uVar3 = *(ulong *)(dst + 8);
  if (this->_allocated < uVar3) {
    in_RAX = (longlong *)sq_vm_realloc(this->_vals,this->_allocated << 3,uVar3 * 8);
    this->_vals = in_RAX;
    this->_allocated = uVar3;
    uVar3 = *(ulong *)(dst + 8);
  }
  if (uVar3 == 0) {
    uVar3 = 0;
  }
  else {
    in_RAX = this->_vals;
    lVar1 = *(long *)dst;
    uVar2 = 0;
    do {
      in_RAX[uVar2] = *(longlong *)(lVar1 + uVar2 * 8);
      uVar2 = uVar2 + 1;
      uVar3 = *(ulong *)(dst + 8);
    } while (uVar2 < uVar3);
  }
  this->_size = uVar3;
  return (int)in_RAX;
}

Assistant:

void copy(const sqvector<T>& v)
    {
        if(_size) {
            resize(0); //destroys all previous stuff
        }
        //resize(v._size);
        if(v._size > _allocated) {
            _realloc(v._size);
        }
        for(SQUnsignedInteger i = 0; i < v._size; i++) {
            new ((void *)&_vals[i]) T(v._vals[i]);
        }
        _size = v._size;
    }